

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

double calculator::toAny<double>(string *s)

{
  double t;
  stringstream ss;
  double local_198;
  stringstream local_190 [16];
  ostream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_180,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::istream::_M_extract<double>((double *)local_190);
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return local_198;
}

Assistant:

inline T toAny(const std::string& s) {
    std::stringstream ss;
    ss << s;
    T t;
    ss >> t;
    return t;
}